

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

Array<asl::String> __thiscall asl::Array<asl::File>::with<asl::String>(Array<asl::File> *this)

{
  long lVar1;
  long *in_RSI;
  char *b;
  long lVar2;
  long lVar3;
  long lVar4;
  
  Array<asl::String>::alloc((Array<asl::String> *)this,*(int *)(*in_RSI + -0x10));
  lVar1 = *in_RSI;
  if (0 < *(int *)(lVar1 + -0x10)) {
    lVar4 = 0x10;
    lVar2 = 0;
    lVar3 = 0;
    do {
      if (*(int *)(lVar1 + -8 + lVar4) == 0) {
        b = (char *)(lVar1 + lVar4);
      }
      else {
        b = *(char **)(lVar1 + lVar4);
      }
      String::assign((String *)((long)&this->_a->_file + lVar2),b,*(int *)(lVar1 + -4 + lVar4));
      lVar3 = lVar3 + 1;
      lVar1 = *in_RSI;
      lVar4 = lVar4 + 0x48;
      lVar2 = lVar2 + 0x18;
    } while (lVar3 < *(int *)(lVar1 + -0x10));
  }
  return (Array<asl::String>)(String *)this;
}

Assistant:

ASL_API Array<String> Array<File>::with<String>() const
{
	Array<String> b(length());
	for (int i = 0; i < length(); i++)
		b[i] = _a[i].path();
	return b;
}